

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void __thiscall Process::fileOutPut(Process *this,vector<int,_std::allocator<int>_> *distribution)

{
  ostream *this_00;
  long *plVar1;
  long lVar2;
  double dVar3;
  ofstream LayerOutput;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,"../Results/Distibution.txt",_S_out);
  dVar3 = this->tau * 0.0;
  if (dVar3 < (double)this->T) {
    lVar2 = 0;
    do {
      this_00 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"\t\t",2);
      plVar1 = (long *)std::ostream::operator<<
                                 (this_00,(distribution->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data._M_start[lVar2]);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      lVar2 = lVar2 + 1;
      dVar3 = (double)(int)lVar2 * this->tau;
    } while (dVar3 < (double)this->T);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Process::fileOutPut(std::vector<int> distribution){
    std::ofstream LayerOutput("../Results/Distibution.txt");
            for (int i = 0; i*tau < T; i++) {
                LayerOutput << i * tau << "\t\t" << distribution[i] << std::endl;
            }

}